

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O1

void __thiscall
cppcms::application_specific_pool::~application_specific_pool(application_specific_pool *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  this->_vptr_application_specific_pool = (_func_int **)&PTR__application_specific_pool_00288850;
  booster::hold_ptr<cppcms::application_specific_pool::_data>::~hold_ptr(&this->d);
  p_Var2 = (this->super_enable_shared_from_this<cppcms::application_specific_pool>)._M_weak_this.
           super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

application_specific_pool::~application_specific_pool()
{
}